

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.hpp
# Opt level: O3

float __thiscall hnsw::L2Distance::operator()(L2Distance *this,float *p1,float *p2)

{
  size_t *psVar1;
  long lVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar18 [16];
  undefined1 auVar17 [64];
  float sum;
  undefined1 auVar19 [16];
  
  psVar1 = &(this->super_Distance).num;
  *psVar1 = *psVar1 + 1;
  auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar15 = ZEXT1632(ZEXT816(0) << 0x40);
  uVar12 = (this->super_Distance).dim_;
  uVar13 = (uint)uVar12;
  uVar8 = uVar13 & 0xf;
  uVar13 = uVar13 & 0xfffffff0;
  if ((uVar12 & 0xfffffff0) != 0) {
    lVar9 = 0;
    do {
      auVar16 = vsubps_avx(*(undefined1 (*) [32])(p1 + lVar9),*(undefined1 (*) [32])(p2 + lVar9));
      auVar7 = vsubps_avx(*(undefined1 (*) [32])(p1 + lVar9 + 8),
                          *(undefined1 (*) [32])(p2 + lVar9 + 8));
      lVar9 = lVar9 + 0x10;
      auVar15._0_4_ = auVar17._0_4_ + auVar16._0_4_ * auVar16._0_4_ + auVar7._0_4_ * auVar7._0_4_;
      auVar15._4_4_ = auVar17._4_4_ + auVar16._4_4_ * auVar16._4_4_ + auVar7._4_4_ * auVar7._4_4_;
      auVar15._8_4_ = auVar17._8_4_ + auVar16._8_4_ * auVar16._8_4_ + auVar7._8_4_ * auVar7._8_4_;
      auVar15._12_4_ =
           auVar17._12_4_ + auVar16._12_4_ * auVar16._12_4_ + auVar7._12_4_ * auVar7._12_4_;
      auVar15._16_4_ =
           auVar17._16_4_ + auVar16._16_4_ * auVar16._16_4_ + auVar7._16_4_ * auVar7._16_4_;
      auVar15._20_4_ =
           auVar17._20_4_ + auVar16._20_4_ * auVar16._20_4_ + auVar7._20_4_ * auVar7._20_4_;
      auVar15._24_4_ =
           auVar17._24_4_ + auVar16._24_4_ * auVar16._24_4_ + auVar7._24_4_ * auVar7._24_4_;
      auVar15._28_4_ = auVar17._28_4_ + auVar16._28_4_ + auVar7._28_4_;
      auVar17 = ZEXT3264(auVar15);
    } while ((uint)lVar9 < uVar13);
  }
  pauVar10 = (undefined1 (*) [32])(p1 + uVar13);
  pauVar11 = (undefined1 (*) [32])(p2 + uVar13);
  auVar16 = auVar15;
  if (7 < uVar8) {
    auVar16 = *pauVar10;
    uVar8 = uVar8 - 8;
    pauVar10 = pauVar10 + 1;
    auVar7 = vsubps_avx(auVar16,*pauVar11);
    pauVar11 = pauVar11 + 1;
    auVar16._0_4_ = auVar15._0_4_ + auVar7._0_4_ * auVar7._0_4_;
    auVar16._4_4_ = auVar15._4_4_ + auVar7._4_4_ * auVar7._4_4_;
    auVar16._8_4_ = auVar15._8_4_ + auVar7._8_4_ * auVar7._8_4_;
    auVar16._12_4_ = auVar15._12_4_ + auVar7._12_4_ * auVar7._12_4_;
    auVar16._16_4_ = auVar15._16_4_ + auVar7._16_4_ * auVar7._16_4_;
    auVar16._20_4_ = auVar15._20_4_ + auVar7._20_4_ * auVar7._20_4_;
    auVar16._24_4_ = auVar15._24_4_ + auVar7._24_4_ * auVar7._24_4_;
    auVar16._28_4_ = auVar15._28_4_ + auVar7._28_4_;
  }
  auVar14 = auVar16._0_16_;
  auVar19 = vhaddps_avx(auVar14,auVar14);
  auVar4 = vshufpd_avx(auVar14,auVar14,1);
  auVar6 = vshufps_avx(auVar14,auVar14,0xff);
  auVar18 = auVar16._16_16_;
  auVar14 = vmovshdup_avx(auVar18);
  auVar5 = vshufpd_avx(auVar18,auVar18,1);
  auVar18 = vshufps_avx(auVar18,auVar18,0xff);
  fVar3 = auVar18._0_4_ +
          auVar5._0_4_ +
          auVar14._0_4_ + auVar16._16_4_ + auVar6._0_4_ + auVar4._0_4_ + auVar19._0_4_;
  if (uVar8 != 0) {
    auVar19._0_12_ = ZEXT812(0);
    auVar19._12_4_ = 0;
    uVar12 = 0;
    do {
      lVar9 = uVar12 * 4;
      lVar2 = uVar12 * 4;
      uVar12 = uVar12 + 1;
      auVar14 = ZEXT416((uint)(*(float *)(*pauVar10 + lVar9) - *(float *)(*pauVar11 + lVar2)));
      auVar19 = vfmadd231ss_fma(auVar19,auVar14,auVar14);
    } while (uVar8 != uVar12);
    fVar3 = fVar3 + auVar19._0_4_;
  }
  return fVar3;
}

Assistant:

float operator()(const float *p1, const float *p2) const {
    num += 1;
#ifndef __AVX__
    return Sqr_(p1, p2, dim_);
#else
    float result = 0;

    __m256 sum;
    __m256 tmp0, tmp1;
    unsigned residual_size = dim_ % 16;
    unsigned aligned_size = dim_ - residual_size;
    const float *residual_start1 = p1 + aligned_size;
    const float *residual_start2 = p2 + aligned_size;
    float unpack[8] __attribute__((aligned(32))) = {0, 0, 0, 0, 0, 0, 0, 0};

    sum = _mm256_loadu_ps(unpack);

    const float *ptr1 = p1;
    const float *ptr2 = p2;
    for (unsigned i = 0; i < aligned_size; i += 16, ptr1 += 16, ptr2 += 16) {
      AVX_L2SQR(ptr1, ptr2, sum, tmp0, tmp1);
      AVX_L2SQR(ptr1 + 8, ptr2 + 8, sum, tmp0, tmp1);
    }
    if (residual_size >= 8) {
      AVX_L2SQR(residual_start1, residual_start2, sum, tmp0, tmp1);
      residual_size -= 8;
      residual_start1 += 8;
      residual_start2 += 8;
    }
    _mm256_storeu_ps(unpack, sum);
    result = unpack[0] + unpack[1] + unpack[2] + unpack[3] + unpack[4] + unpack[5] + unpack[6] +
             unpack[7];

    if (residual_size > 0) {
      result += Sqr_(residual_start1, residual_start2, residual_size);
    }
    return result;
#endif
  }

 private:
  float Sqr_(const float *p1, const float *p2, uint32_t size) const {
    // Auto vectorized with -O3 flag
    float sum = 0;
    for (size_t i = 0; i < size; i++) {
      float tmp = p1[i] - p2[i];
      sum += tmp * tmp;
    }
    return sum;
  }